

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O3

void __thiscall CMU462::Camera::compute_position(Camera *this)

{
  Matrix3x3 *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  Vector3D *pVVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dStack_50;
  
  dVar15 = sin(this->phi);
  uVar7 = SUB84(dVar15,0);
  uVar8 = (undefined4)((ulong)dVar15 >> 0x20);
  if ((dVar15 == 0.0) && (!NAN(dVar15))) {
    dVar15 = this->phi + 9.999999747378752e-06;
    this->phi = dVar15;
    dVar15 = sin(dVar15);
    uVar7 = SUB84(dVar15,0);
    uVar8 = (undefined4)((ulong)dVar15 >> 0x20);
  }
  dVar15 = this->r;
  dVar9 = sin(this->theta);
  dVar12 = this->r;
  dVar13 = cos(this->phi);
  dVar14 = this->r;
  dVar11 = cos(this->theta);
  dVar9 = dVar9 * dVar15 * (double)CONCAT44(uVar8,uVar7);
  dVar13 = dVar13 * dVar12;
  dVar15 = (this->targetPos).x + dVar9;
  dVar12 = (this->targetPos).y + dVar13;
  auVar5._8_4_ = SUB84(dVar12,0);
  auVar5._0_8_ = dVar15;
  auVar5._12_4_ = (int)((ulong)dVar12 >> 0x20);
  (this->pos).x = dVar15;
  (this->pos).y = (double)auVar5._8_8_;
  dVar15 = *(double *)
            (&DAT_001e4880 +
            (ulong)(0.0 <= (double)CONCAT44(uVar8,uVar7) && (double)CONCAT44(uVar8,uVar7) != 0.0) *
            8);
  dVar10 = dVar13 * 0.0 - dVar9 * dVar15;
  this_00 = &this->c2w;
  dVar11 = dVar11 * (double)CONCAT44(uVar8,uVar7) * dVar14;
  (this->pos).z = (this->targetPos).z + dVar11;
  auVar1._8_4_ = SUB84(dVar9,0);
  auVar1._0_8_ = dVar11;
  auVar1._12_4_ = (int)((ulong)dVar9 >> 0x20);
  pVVar6 = Matrix3x3::operator[](this_00,0);
  dVar12 = dVar11 * dVar15 + dVar13 * -0.0;
  dVar14 = dVar9 * 0.0 + dVar11 * -0.0;
  dVar15 = 1.0 / SQRT(dVar10 * dVar10 + dVar12 * dVar12 + dVar14 * dVar14);
  dVar10 = dVar10 * dVar15;
  dVar12 = dVar15 * dVar12;
  dVar15 = dVar15 * dVar14;
  auVar2._8_4_ = SUB84(dVar15,0);
  auVar2._0_8_ = dVar12;
  auVar2._12_4_ = (int)((ulong)dVar15 >> 0x20);
  pVVar6->x = dVar12;
  pVVar6->y = (double)auVar2._8_8_;
  dStack_50 = auVar1._8_8_;
  dVar14 = dVar10 * dVar13 - dVar15 * dVar11;
  dVar4 = dVar11 * dVar12 - dVar10 * dStack_50;
  dVar12 = dVar15 * dVar9 - dVar12 * dVar13;
  dVar15 = 1.0 / SQRT(dVar12 * dVar12 + dVar14 * dVar14 + dVar4 * dVar4);
  pVVar6->z = dVar10;
  pVVar6 = Matrix3x3::operator[](this_00,1);
  pVVar6->x = dVar15 * dVar14;
  pVVar6->y = dVar15 * dVar4;
  pVVar6->z = dVar12 * dVar15;
  dVar15 = 1.0 / SQRT(dVar11 * dVar11 + dVar9 * dVar9 + dVar13 * dVar13);
  pVVar6 = Matrix3x3::operator[](this_00,2);
  auVar3._8_4_ = SUB84(dVar15 * dVar13,0);
  auVar3._0_8_ = dVar15 * dVar9;
  auVar3._12_4_ = (int)((ulong)(dVar15 * dVar13) >> 0x20);
  pVVar6->x = dVar15 * dVar9;
  pVVar6->y = (double)auVar3._8_8_;
  pVVar6->z = dVar11 * dVar15;
  return;
}

Assistant:

void Camera::compute_position() {
    double sinPhi = sin(phi);
    if (sinPhi == 0) {
      phi += EPS_F;
      sinPhi = sin(phi);
    }
    const Vector3D dirToCamera(r * sinPhi * sin(theta),
        r * cos(phi),
        r * sinPhi * cos(theta));
    pos = targetPos + dirToCamera;
    Vector3D upVec(0, sinPhi > 0 ? 1 : -1, 0);
    Vector3D screenXDir = cross(upVec, dirToCamera);
    screenXDir.normalize();
    Vector3D screenYDir = cross(dirToCamera, screenXDir);
    screenYDir.normalize();

    c2w[0] = screenXDir;
    c2w[1] = screenYDir;
    c2w[2] = dirToCamera.unit();   // camera's view direction is the
    // opposite of of dirToCamera, so
    // directly using dirToCamera as
    // column 2 of the matrix takes [0 0 -1]
    // to the world space view direction
  }